

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.h
# Opt level: O2

void __thiscall Highs::~Highs(Highs *this)

{
  FILE *__stream;
  
  this->_vptr_Highs = (_func_int **)&PTR__Highs_004328a0;
  __stream = (FILE *)(this->options_).super_HighsOptionsStruct.log_options.log_stream;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  PresolveComponent::~PresolveComponent(&this->presolve_);
  std::_Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::~_Vector_base
            ((_Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_> *)
             &this->presolve_log_);
  HEkk::~HEkk(&this->ekk_instance_);
  HighsSparseMatrix::~HighsSparseMatrix(&this->standard_form_matrix_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>);
  std::vector<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_>::~vector
            (&this->saved_objective_and_solution_);
  HighsIis::~HighsIis(&this->iis_);
  HighsRanging::~HighsRanging(&this->ranging_);
  HighsInfo::~HighsInfo(&this->info_);
  HighsOptions::~HighsOptions(&this->options_);
  HighsCallback::~HighsCallback(&this->callback_);
  HighsTimer::~HighsTimer(&this->timer_);
  HighsModel::~HighsModel(&this->presolved_model_);
  std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::~vector
            (&this->multi_linear_objective_);
  HighsModel::~HighsModel(&this->model_);
  ICrashInfo::~ICrashInfo(&this->icrash_info_);
  HighsBasis::~HighsBasis(&this->basis_);
  HighsSolution::~HighsSolution(&this->solution_);
  return;
}

Assistant:

virtual ~Highs() {
    FILE* log_stream = options_.log_options.log_stream;
    if (log_stream != nullptr) {
      assert(log_stream != stdout);
      fclose(log_stream);
    }
  }